

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O2

uchar * rans_uncompress_O0(uchar *in,uint in_size,uint *out_size)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ulong uVar10;
  void *__ptr;
  uint freq;
  uint32_t uVar11;
  long lVar12;
  ulong uVar13;
  ulong *puVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  uint __c;
  uchar *puVar18;
  RansDecSymbol syms [256];
  RansState local_490;
  RansState local_48c;
  undefined8 local_488;
  undefined8 uStack_480;
  ulong *local_470;
  uchar *local_468;
  RansState local_45c;
  ulong local_458;
  ulong local_450;
  ulong local_448;
  uint *local_440;
  RansDecSymbol aRStack_438 [258];
  
  if ((*in != '\0') || (*(int *)(in + 1) != in_size - 9)) {
    return (uchar *)0x0;
  }
  bVar15 = in[5];
  local_450 = (long)(int)((uint)*(ushort *)(in + 7) << 0x10) | (ulong)in[6] << 8 | (ulong)bVar15;
  local_468 = (uchar *)malloc(local_450);
  uVar16 = 0;
  if (local_468 == (uchar *)0x0) {
    return (uchar *)0x0;
  }
  __c = (uint)in[9];
  puVar14 = (ulong *)(in + 10);
  __ptr = (void *)0x0;
  uVar11 = 0;
  local_448 = (ulong)bVar15;
  local_440 = out_size;
  do {
    bVar15 = (byte)*puVar14;
    freq = (uint)bVar15;
    if ((char)bVar15 < '\0') {
      pbVar1 = (byte *)((long)puVar14 + 1);
      puVar14 = (ulong *)((long)puVar14 + 2);
      freq = (bVar15 & 0x7f) << 8 | (uint)*pbVar1;
    }
    else {
      puVar14 = (ulong *)((long)puVar14 + 1);
    }
    RansDecSymbolInit(aRStack_438 + (int)__c,uVar11,freq);
    if (__ptr == (void *)0x0) {
      __ptr = malloc(0x1000);
    }
    memset((void *)((long)(int)uVar11 + (long)__ptr),__c,(ulong)freq);
    if (uVar16 == 0) {
      uVar13 = *puVar14;
      if (__c + 1 == (uint)(byte)uVar13) {
        uVar16 = (uint)*(byte *)((long)puVar14 + 1);
        puVar14 = (ulong *)((long)puVar14 + 2);
        goto LAB_00124133;
      }
      puVar14 = (ulong *)((long)puVar14 + 1);
      uVar16 = 0;
      __c = (uint)(byte)uVar13;
    }
    else {
      uVar16 = uVar16 - 1;
LAB_00124133:
      __c = __c + 1;
    }
    uVar11 = freq + uVar11;
  } while (__c != 0);
  if (0xfff < (int)uVar11) {
    __assert_fail("x < TOTFREQ",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                  ,0x102,
                  "unsigned char *rans_uncompress_O0(unsigned char *, unsigned int, unsigned int *)"
                 );
  }
  local_470 = puVar14 + 2;
  local_458 = (long)(int)local_450 & 0xfffffffffffffffc;
  local_490 = (RansState)*puVar14;
  local_48c = *(RansState *)((long)puVar14 + 4);
  local_488 = *puVar14;
  uStack_480 = puVar14[1];
  local_45c = (RansState)uStack_480;
  lVar12 = 0;
  uVar13 = local_458;
  while( true ) {
    uVar17 = local_458;
    uVar10 = uStack_480;
    if ((long)uVar13 <= lVar12) break;
    bVar15 = *(byte *)((long)__ptr + (local_488 & 0xfff));
    bVar2 = *(byte *)((long)__ptr + ((ulong)local_488._4_4_ & 0xfff));
    bVar3 = *(byte *)((long)__ptr + (uStack_480 & 0xfff));
    bVar4 = *(byte *)((long)__ptr + ((ulong)uStack_480._4_4_ & 0xfff));
    uVar5 = aRStack_438[bVar15].freq;
    uVar6 = aRStack_438[bVar2].freq;
    uVar7 = aRStack_438[bVar3].freq;
    uVar8 = aRStack_438[bVar4].freq;
    local_468[lVar12] = bVar15;
    uVar9 = aRStack_438[bVar15].start;
    local_468[lVar12 + 1] = bVar2;
    local_488 = CONCAT44(((local_488._4_4_ >> 0xc) * (uint)uVar6 +
                         (int)((ulong)local_488._4_4_ & 0xfff)) - (uint)aRStack_438[bVar2].start,
                         (((uint)local_488 >> 0xc) * (uint)uVar5 + (int)(local_488 & 0xfff)) -
                         (uint)uVar9);
    local_468[lVar12 + 2] = bVar3;
    uVar5 = aRStack_438[bVar3].start;
    local_468[lVar12 + 3] = bVar4;
    uStack_480 = CONCAT44(((uStack_480._4_4_ >> 0xc) * (uint)uVar8 +
                          (int)((ulong)uStack_480._4_4_ & 0xfff)) - (uint)aRStack_438[bVar4].start,
                          (((uint)uStack_480 >> 0xc) * (uint)uVar7 + (int)(uStack_480 & 0xfff)) -
                          (uint)uVar5);
    RansDecRenorm((RansState *)&local_488,(uint8_t **)&local_470);
    RansDecRenorm((RansState *)((long)&local_488 + 4),(uint8_t **)&local_470);
    RansDecRenorm((RansState *)&uStack_480,(uint8_t **)&local_470);
    RansDecRenorm((RansState *)((long)&uStack_480 + 4),(uint8_t **)&local_470);
    lVar12 = lVar12 + 4;
    uVar13 = uVar17;
  }
  local_490 = (uint)local_488;
  uVar17 = (ulong)local_488._4_4_;
  local_48c = local_488._4_4_;
  local_45c = (uint)uStack_480;
  uVar11 = 0x148108;
  switch((uint)local_448 & 3) {
  case 0:
    goto switchD_00124314_caseD_0;
  case 1:
    bVar15 = *(byte *)((long)__ptr + (ulong)((uint)local_488 & 0xfff));
    RansDecAdvanceSymbol(&local_490,(uint8_t **)&local_470,aRStack_438 + bVar15,0x148108);
    puVar18 = local_468;
    goto LAB_00124426;
  case 2:
    bVar15 = *(byte *)((long)__ptr + (local_488 & 0xfff));
    RansDecAdvanceSymbol(&local_490,(uint8_t **)&local_470,aRStack_438 + bVar15,0x148108);
    uVar13 = local_458;
    puVar18 = local_468;
    local_468[local_458] = bVar15;
    bVar15 = *(byte *)((long)__ptr + (uVar17 & 0xfff));
    RansDecAdvanceSymbol(&local_48c,(uint8_t **)&local_470,aRStack_438 + bVar15,uVar11);
    uVar16 = (uint)uVar13 | 1;
    break;
  case 3:
    uVar11 = 0xfff;
    bVar15 = *(byte *)((long)__ptr + (local_488 & 0xfff));
    RansDecAdvanceSymbol(&local_490,(uint8_t **)&local_470,aRStack_438 + bVar15,0xfff);
    puVar18 = local_468;
    local_468[uVar13] = bVar15;
    bVar15 = *(byte *)((long)__ptr + (uVar17 & 0xfff));
    RansDecAdvanceSymbol(&local_48c,(uint8_t **)&local_470,aRStack_438 + bVar15,uVar11);
    puVar18[(long)(int)(uint)uVar13 + 1] = bVar15;
    bVar15 = *(byte *)((long)__ptr + (uVar10 & 0xfff));
    RansDecAdvanceSymbol(&local_45c,(uint8_t **)&local_470,aRStack_438 + bVar15,uVar11);
    uVar16 = (uint)uVar13 | 2;
  }
  uVar13 = (ulong)(int)uVar16;
LAB_00124426:
  puVar18[uVar13] = bVar15;
switchD_00124314_caseD_0:
  *local_440 = (uint)local_450;
  free(__ptr);
  return local_468;
}

Assistant:

unsigned char *rans_uncompress_O0(unsigned char *in, unsigned int in_size,
				  unsigned int *out_size) {
    /* Load in the static tables */
    unsigned char *cp = in + 9;
    int i, j, x, out_sz, in_sz, rle;
    char *out_buf;
    ari_decoder D;
    RansDecSymbol syms[256];

    memset(&D, 0, sizeof(D));

    if (*in++ != 0) // Order-0 check
	return NULL;
    
    in_sz  = ((in[0])<<0) | ((in[1])<<8) | ((in[2])<<16) | ((in[3])<<24);
    out_sz = ((in[4])<<0) | ((in[5])<<8) | ((in[6])<<16) | ((in[7])<<24);
    if (in_sz != in_size-9)
	return NULL;

    out_buf = malloc(out_sz);
    if (!out_buf)
	return NULL;

    //fprintf(stderr, "out_sz=%d\n", out_sz);

    // Precompute reverse lookup of frequency.
    rle = x = 0;
    j = *cp++;
    do {
	if ((D.fc[j].F = *cp++) >= 128) {
	    D.fc[j].F &= ~128;
	    D.fc[j].F = ((D.fc[j].F & 127) << 8) | *cp++;
	}
	D.fc[j].C = x;

	RansDecSymbolInit(&syms[j], D.fc[j].C, D.fc[j].F);

	/* Build reverse lookup table */
	if (!D.R) D.R = (unsigned char *)malloc(TOTFREQ);
	memset(&D.R[x], j, D.fc[j].F);

	x += D.fc[j].F;

	if (!rle && j+1 == *cp) {
	    j = *cp++;
	    rle = *cp++;
	} else if (rle) {
	    rle--;
	    j++;
	} else {
	    j = *cp++;
	}
    } while(j);

    assert(x < TOTFREQ);

    RansState rans0, rans1, rans2, rans3;
    uint8_t *ptr = cp;
    RansDecInit(&rans0, &ptr);
    RansDecInit(&rans1, &ptr);
    RansDecInit(&rans2, &ptr);
    RansDecInit(&rans3, &ptr);

    int out_end = (out_sz&~3);

    RansState R[4];
    R[0] = rans0;
    R[1] = rans1;
    R[2] = rans2;
    R[3] = rans3;
    uint32_t mask = (1u << TF_SHIFT)-1;

    for (i=0; i < out_end; i+=4) {
	uint32_t m[4] = {R[0] & mask,
			 R[1] & mask,
			 R[2] & mask,
			 R[3] & mask};
	uint8_t c[4] = {D.R[m[0]],
			D.R[m[1]],
			D.R[m[2]],
			D.R[m[3]]};
	out_buf[i+0] = c[0];
	out_buf[i+1] = c[1];
	out_buf[i+2] = c[2];
	out_buf[i+3] = c[3];

	// RansDecAdvanceSymbolStep(&R[0], &syms[c[0]], TF_SHIFT);
	// RansDecAdvanceSymbolStep(&R[1], &syms[c[1]], TF_SHIFT);
	// RansDecAdvanceSymbolStep(&R[2], &syms[c[2]], TF_SHIFT);
	// RansDecAdvanceSymbolStep(&R[3], &syms[c[3]], TF_SHIFT);
	R[0] = syms[c[0]].freq * (R[0]>>TF_SHIFT);
	R[1] = syms[c[1]].freq * (R[1]>>TF_SHIFT);
	R[2] = syms[c[2]].freq * (R[2]>>TF_SHIFT);
	R[3] = syms[c[3]].freq * (R[3]>>TF_SHIFT);

	R[0] += m[0] - syms[c[0]].start;
	R[1] += m[1] - syms[c[1]].start;
	R[2] += m[2] - syms[c[2]].start;
	R[3] += m[3] - syms[c[3]].start;

	RansDecRenorm(&R[0], &ptr);
	RansDecRenorm(&R[1], &ptr);
	RansDecRenorm(&R[2], &ptr);
	RansDecRenorm(&R[3], &ptr);
    }

    rans0 = R[0];
    rans1 = R[1];
    rans2 = R[2];
    rans3 = R[3];

    switch(out_sz&3) {
	unsigned char c;
    case 0:
	break;
    case 1:
	c = D.R[RansDecGet(&rans0, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans0, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end] = c;
	break;

    case 2:
	c = D.R[RansDecGet(&rans0, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans0, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end] = c;

	c = D.R[RansDecGet(&rans1, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans1, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end+1] = c;
	break;

    case 3:
	c = D.R[RansDecGet(&rans0, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans0, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end] = c;

	c = D.R[RansDecGet(&rans1, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans1, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end+1] = c;

	c = D.R[RansDecGet(&rans2, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans2, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end+2] = c;
	break;
    }

    *out_size = out_sz;

    if (D.R) free(D.R);

    return (unsigned char *)out_buf;
}